

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int write_file(char *path,char *value)

{
  int __fd;
  int *piVar1;
  size_t sVar2;
  ssize_t sVar3;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  int len;
  int ret;
  int fd;
  undefined4 local_4;
  
  __fd = open(in_RDI,0x41,0x192);
  if (__fd < 0) {
    piVar1 = __errno_location();
    local_4 = -*piVar1;
  }
  else {
    sVar2 = strlen(in_RSI);
    do {
      sVar3 = write(__fd,in_RSI,(long)(int)sVar2);
      bVar4 = false;
      if ((int)sVar3 < 0) {
        piVar1 = __errno_location();
        bVar4 = *piVar1 == 4;
      }
    } while (bVar4);
    close(__fd);
    if ((int)sVar3 < 0) {
      piVar1 = __errno_location();
      local_4 = -*piVar1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int write_file(const char *path, const char *value)
{
    int fd, ret, len;

    fd = open(path, O_WRONLY|O_CREAT, 0622);

    if (fd < 0)
        return -errno;

    len = strlen(value);

    do {
        ret = write(fd, value, len);
    } while (ret < 0 && errno == EINTR);

    close(fd);
    if (ret < 0) {
        return -errno;
    } else {
        return 0;
    }
}